

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

void __thiscall anurbs::RTree<3L>::add(RTree<3L> *this,Vector *box_a,Vector *box_b)

{
  double dVar1;
  Scalar SVar2;
  size_type __n;
  size_type *psVar3;
  Index IVar4;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  reference pvVar7;
  long local_68;
  Index i_1;
  Index i;
  Vector box_max;
  Vector box_min;
  Index index;
  Vector *box_b_local;
  Vector *box_a_local;
  RTree<3L> *this_local;
  
  __n = this->m_position;
  this->m_position = __n + 1;
  psVar3 = (size_type *)std::vector<long,_std::allocator<long>_>::operator[](&this->m_indices,__n);
  *psVar3 = __n;
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            ((Matrix<double,_1,_3,_1,_1,_3> *)
             (box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)&i);
  i_1 = 0;
  while( true ) {
    IVar4 = dimension();
    if (IVar4 <= i_1) break;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a,i_1);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b,i_1);
    if (*pdVar5 <= dVar1) {
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b,i_1);
      dVar1 = *pdVar5;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                          (box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                           m_storage.m_data.array + 2),i_1);
      *pSVar6 = dVar1;
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a,i_1);
      dVar1 = *pdVar5;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&i,i_1);
      *pSVar6 = dVar1;
    }
    else {
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a,i_1);
      dVar1 = *pdVar5;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                          (box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                           m_storage.m_data.array + 2),i_1);
      *pSVar6 = dVar1;
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b,i_1);
      dVar1 = *pdVar5;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&i,i_1);
      *pSVar6 = dVar1;
    }
    i_1 = i_1 + 1;
  }
  pvVar7 = std::
           vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           ::operator[](&this->m_boxes_min,__n);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=
            (pvVar7,(Matrix<double,_1,_3,_1,_1,_3> *)
                    (box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                     m_data.array + 2));
  pvVar7 = std::
           vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           ::operator[](&this->m_boxes_max,__n);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::operator=(pvVar7,(Matrix<double,_1,_3,_1,_1,_3> *)&i);
  local_68 = 0;
  while( true ) {
    IVar4 = dimension();
    if (IVar4 <= local_68) break;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                        (box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                         m_storage.m_data.array + 2),local_68);
    dVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&this->m_min,
                        local_68);
    if (dVar1 < *pSVar6) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                          (box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                           m_storage.m_data.array + 2),local_68);
      SVar2 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&this->m_min,
                          local_68);
      *pSVar6 = SVar2;
    }
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&i,local_68);
    dVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&this->m_max,
                        local_68);
    if (*pSVar6 <= dVar1 && dVar1 != *pSVar6) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&i,local_68);
      SVar2 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&this->m_max,
                          local_68);
      *pSVar6 = SVar2;
    }
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

void add(const Vector box_a, const Vector box_b)
    {
        // FIXME: check m_position

        Index index = m_position++;

        m_indices[index] = index;

        Vector box_min;
        Vector box_max;

        for (Index i = 0; i < dimension(); i++) {
            if (box_a[i] < box_b[i]) {
                box_min[i] = box_a[i];
                box_max[i] = box_b[i];
            } else {
                box_min[i] = box_b[i];
                box_max[i] = box_a[i];
            }
        }

        m_boxes_min[index] = box_min;
        m_boxes_max[index] = box_max;

        for (Index i = 0; i < dimension(); i++) {
            if (box_min[i] < m_min[i]) {
                m_min[i] = box_min[i];
            }
            if (box_max[i] > m_max[i]) {
                m_max[i] = box_max[i];
            }
        }
    }